

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirscanner_unix.cpp
# Opt level: O2

void __thiscall trun::DirScanner::DirScanner(DirScanner *this)

{
  ILogger *pIVar1;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (this->filenames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filenames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filenames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->recurse = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,".so",&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->extensions,
             &local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"DirScanner",&local_39);
  pIVar1 = gnilk::Logger::GetLogger(&local_38);
  this->pLogger = pIVar1;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

DirScanner::DirScanner() {
    this->recurse = true;
#ifdef APPLE
    extensions.push_back(".dylib");
#else
    extensions.push_back(".so");
#endif
    pLogger = gnilk::Logger::GetLogger("DirScanner");
}